

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertySpecification.cpp
# Opt level: O2

PropertyDefinition * __thiscall
Rml::PropertySpecification::RegisterProperty
          (PropertySpecification *this,String *property_name,String *default_value,bool inherited,
          bool forces_layout,PropertyId id)

{
  IdNameMap<Rml::PropertyId> *this_00;
  code *pcVar1;
  _Head_base<0UL,_Rml::PropertyDefinition_*,_false> __p;
  bool bVar2;
  uint uVar3;
  pointer puVar5;
  undefined3 in_register_00000089;
  PropertyId id_local;
  bool forces_layout_local;
  bool inherited_local;
  _Head_base<0UL,_Rml::PropertyDefinition_*,_false> local_38;
  ulong uVar4;
  
  uVar3 = CONCAT31(in_register_00000089,id);
  this_00 = &((this->property_map)._M_t.
              super___uniq_ptr_impl<Rml::PropertyIdNameMap,_std::default_delete<Rml::PropertyIdNameMap>_>
              ._M_t.
              super__Tuple_impl<0UL,_Rml::PropertyIdNameMap_*,_std::default_delete<Rml::PropertyIdNameMap>_>
              .super__Head_base<0UL,_Rml::PropertyIdNameMap_*,_false>._M_head_impl)->
             super_IdNameMap<Rml::PropertyId>;
  id_local = id;
  forces_layout_local = forces_layout;
  inherited_local = inherited;
  if (uVar3 == 0) {
    id_local = IdNameMap<Rml::PropertyId>::GetOrCreateId(this_00,property_name);
    uVar3 = (uint)id_local;
  }
  else {
    IdNameMap<Rml::PropertyId>::AddPair(this_00,id,property_name);
  }
  if ((char)uVar3 < '\0') {
    Log::Message(LT_ERROR,
                 "Fatal error while registering property \'%s\': Maximum number of allowed properties exceeded. Continuing execution may lead to crash."
                 ,(property_name->_M_dataplus)._M_p);
    bVar2 = Assert("RMLUI_ERROR",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/PropertySpecification.cpp"
                   ,0x42);
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (this->properties).
             super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    goto LAB_002bac54;
  }
  uVar3 = uVar3 & 0xff;
  uVar4 = (ulong)uVar3;
  puVar5 = (this->properties).
           super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (uVar4 < (ulong)((long)(this->properties).
                            super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)puVar5 >> 3)) {
    if ((_Head_base<0UL,_Rml::PropertyDefinition_*,_false>)
        *(_Tuple_impl<0UL,_Rml::PropertyDefinition_*,_std::default_delete<Rml::PropertyDefinition>_>
          *)&puVar5[uVar4]._M_t.
             super___uniq_ptr_impl<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>
        == (PropertyDefinition *)0x0) goto LAB_002babd2;
    Log::Message(LT_ERROR,"While registering property \'%s\': The property is already registered.",
                 (property_name->_M_dataplus)._M_p);
  }
  else {
    ::std::
    vector<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
    ::resize(&this->properties,(uVar3 >> 1) + uVar4 + 1);
LAB_002babd2:
    ::std::
    make_unique<Rml::PropertyDefinition,Rml::PropertyId&,std::__cxx11::string_const&,bool&,bool&>
              ((PropertyId *)&local_38,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&id_local,
               (bool *)default_value,&inherited_local);
    __p._M_head_impl = local_38._M_head_impl;
    local_38._M_head_impl = (PropertyDefinition *)0x0;
    ::std::__uniq_ptr_impl<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>::
    reset((__uniq_ptr_impl<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_> *
          )((long)&(((this->properties).
                     super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                   super___uniq_ptr_impl<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>
           + (ulong)(uVar3 * 8)),__p._M_head_impl);
    ::std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>::
    ~unique_ptr((unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>
                 *)&local_38);
    PropertyIdSet::Insert(&this->property_ids,id_local);
    if (inherited_local == true) {
      PropertyIdSet::Insert(&this->property_ids_inherited,id_local);
    }
    if (forces_layout_local == true) {
      PropertyIdSet::Insert(&this->property_ids_forcing_layout,id_local);
    }
  }
  puVar5 = (pointer)((long)&(((this->properties).
                              super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                            super___uniq_ptr_impl<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>
                    + (ulong)(uVar3 << 3));
LAB_002bac54:
  return (PropertyDefinition *)
         (_Tuple_impl<0UL,_Rml::PropertyDefinition_*,_std::default_delete<Rml::PropertyDefinition>_>
         )*(_Tuple_impl<0UL,_Rml::PropertyDefinition_*,_std::default_delete<Rml::PropertyDefinition>_>
            *)&(puVar5->_M_t).
               super___uniq_ptr_impl<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>
  ;
}

Assistant:

PropertyDefinition& PropertySpecification::RegisterProperty(const String& property_name, const String& default_value, bool inherited,
	bool forces_layout, PropertyId id)
{
	if (id == PropertyId::Invalid)
		id = property_map->GetOrCreateId(property_name);
	else
		property_map->AddPair(id, property_name);

	size_t index = (size_t)id;

	if (index >= size_t(PropertyId::MaxNumIds))
	{
		Log::Message(Log::LT_ERROR,
			"Fatal error while registering property '%s': Maximum number of allowed properties exceeded. Continuing execution may lead to crash.",
			property_name.c_str());
		RMLUI_ERROR;
		return *properties[0];
	}

	if (index < properties.size())
	{
		// We don't want to owerwrite an existing entry.
		if (properties[index])
		{
			Log::Message(Log::LT_ERROR, "While registering property '%s': The property is already registered.", property_name.c_str());
			return *properties[index];
		}
	}
	else
	{
		// Resize vector to hold the new index
		properties.resize((index * 3) / 2 + 1);
	}

	// Create and insert the new property
	properties[index] = MakeUnique<PropertyDefinition>(id, default_value, inherited, forces_layout);
	property_ids.Insert(id);
	if (inherited)
		property_ids_inherited.Insert(id);
	if (forces_layout)
		property_ids_forcing_layout.Insert(id);

	return *properties[index];
}